

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

double __thiscall Minisat::Solver::progressEstimate(Solver *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  __type _Var4;
  int local_48;
  int local_40;
  int end;
  int beg;
  int i;
  double F;
  double progress;
  Solver *this_local;
  
  F = 0.0;
  iVar1 = nVars(this);
  end = 0;
  while( true ) {
    iVar2 = decisionLevel(this);
    if (iVar2 < end) break;
    if (end == 0) {
      local_40 = 0;
    }
    else {
      piVar3 = vec<int,_int>::operator[](&this->trail_lim,end + -1);
      local_40 = *piVar3;
    }
    iVar2 = decisionLevel(this);
    if (end == iVar2) {
      local_48 = vec<Minisat::Lit,_int>::size(&this->trail);
    }
    else {
      piVar3 = vec<int,_int>::operator[](&this->trail_lim,end);
      local_48 = *piVar3;
    }
    _Var4 = std::pow<double,int>(1.0 / (double)iVar1,end);
    F = _Var4 * (double)(local_48 - local_40) + F;
    end = end + 1;
  }
  iVar1 = nVars(this);
  return F / (double)iVar1;
}

Assistant:

double Solver::progressEstimate() const
{
    double  progress = 0;
    double  F = 1.0 / nVars();

    for (int i = 0; i <= decisionLevel(); i++){
        int beg = i == 0 ? 0 : trail_lim[i - 1];
        int end = i == decisionLevel() ? trail.size() : trail_lim[i];
        progress += pow(F, i) * (end - beg);
    }

    return progress / nVars();
}